

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O2

int __thiscall DIS::IFFPdu::getMarshalledSize(IFFPdu *this)

{
  pointer pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  IFFFundamentalParameterData listElement;
  
  iVar2 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_emittingEntityID);
  iVar4 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar5 = Vector3Float::getMarshalledSize(&this->_relativeAntennaLocation);
  iVar6 = SystemIdentifier::getMarshalledSize(&this->_systemID);
  iVar7 = FundamentalOperationalData::getMarshalledSize(&this->_fundamentalOperationalData);
  iVar8 = LayerHeader::getMarshalledSize(&this->_layerHeader);
  iVar9 = BeamData::getMarshalledSize(&this->_beamData);
  iVar10 = SecondaryOperationalData::getMarshalledSize(&this->_secondaryOperationalData);
  iVar2 = iVar10 + iVar7 + iVar6 + iVar8 + iVar5 + iVar4 + iVar3 + iVar2 + iVar9 + 3;
  lVar12 = 8;
  for (uVar11 = 0;
      pIVar1 = (this->_iffParameters).
               super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->_iffParameters).
                             super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 5);
      uVar11 = uVar11 + 1) {
    listElement._vptr_IFFFundamentalParameterData =
         (_func_int **)&PTR__IFFFundamentalParameterData_001c1e18;
    listElement._24_8_ = *(undefined8 *)(pIVar1->_systemSpecificData + lVar12 + -0xd);
    listElement._8_8_ = *(undefined8 *)(pIVar1->_systemSpecificData + lVar12 + -0x1d);
    listElement._16_8_ = *(undefined8 *)(pIVar1->_systemSpecificData + lVar12 + -0x1d + 8);
    iVar3 = IFFFundamentalParameterData::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    IFFFundamentalParameterData::~IFFFundamentalParameterData(&listElement);
    lVar12 = lVar12 + 0x20;
  }
  return iVar2;
}

Assistant:

int IFFPdu::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
    marshalSize = marshalSize + _emittingEntityID.getMarshalledSize();  // _emittingEntityID
    marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
    marshalSize = marshalSize + _relativeAntennaLocation.getMarshalledSize(); //_relativeAntennaLocation
    marshalSize = marshalSize + 1;  // _numberOfIFFParameters
    marshalSize = marshalSize + _systemID.getMarshalledSize(); //_systemID
    marshalSize = marshalSize + 1; //_systemDesignator
    marshalSize = marshalSize + 1; //_systemSpecificData
    marshalSize = marshalSize + _fundamentalOperationalData.getMarshalledSize();  // _fundamentalOperationalData
    marshalSize = marshalSize + _layerHeader.getMarshalledSize();  // _layerHeader
    marshalSize = marshalSize + _beamData.getMarshalledSize();  // _beamData
    marshalSize = marshalSize + _secondaryOperationalData.getMarshalledSize();  // _secondaryOperationalData

    for(unsigned long long idx=0; idx < _iffParameters.size(); idx++)
    {
        IFFFundamentalParameterData listElement = _iffParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}